

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Type * __thiscall soul::heart::Parser::readValueType(Type *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Structure *s_00;
  char (*args) [8];
  char (*args_00) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  CompileMessage local_140;
  Type local_108;
  undefined1 local_f0 [8];
  StructurePtr s;
  string name;
  CompileMessage local_c0;
  CompileMessage local_88;
  undefined1 local_40 [8];
  Type t;
  CodeLocation errorPos;
  Parser *this_local;
  
  CodeLocation::CodeLocation
            ((CodeLocation *)&t.structure,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  readPrimitiveValueType((Type *)local_40,this);
  bVar1 = Type::isComplex((Type *)local_40);
  if (bVar1) {
    Errors::notYetImplemented<char_const(&)[8]>(&local_88,(Errors *)0x54d548,args);
    CodeLocation::throwError((CodeLocation *)&t.structure,&local_88);
  }
  bVar1 = Type::isFixed((Type *)local_40);
  if (bVar1) {
    Errors::notYetImplemented<char_const(&)[6]>(&local_c0,(Errors *)"fixed",args_00);
    CodeLocation::throwError((CodeLocation *)&t.structure,&local_c0);
  }
  bVar1 = Type::isValid((Type *)local_40);
  if (bVar1) {
    Type::Type(__return_storage_ptr__,(Type *)local_40);
  }
  else {
    readQualifiedGeneralIdentifier_abi_cxx11_((string *)&s,this);
    findStruct((Parser *)local_f0,(string *)this);
    bVar1 = RefCountedPtr::operator_cast_to_bool((RefCountedPtr *)local_f0);
    if (bVar1) {
      s_00 = RefCountedPtr<soul::Structure>::operator*((RefCountedPtr<soul::Structure> *)local_f0);
      Type::createStruct(&local_108,s_00);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_108);
      Type::~Type(&local_108);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_f0);
    if (!bVar1) {
      Errors::unresolvedType<std::__cxx11::string&>(&local_140,(Errors *)&s,args_01);
      CodeLocation::throwError((CodeLocation *)&t.structure,&local_140);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  Type::~Type((Type *)local_40);
  CodeLocation::~CodeLocation((CodeLocation *)&t.structure);
  return __return_storage_ptr__;
}

Assistant:

Type readValueType()
    {
        auto errorPos = location;
        auto t = readPrimitiveValueType();

        if (t.isComplex())  errorPos.throwError (Errors::notYetImplemented ("complex"));
        if (t.isFixed())    errorPos.throwError (Errors::notYetImplemented ("fixed"));

        if (t.isValid())
            return t;

        auto name = readQualifiedGeneralIdentifier();

        if (auto s = findStruct (name))
            return parseArrayTypeSuffixes (Type::createStruct (*s));

        errorPos.throwError (Errors::unresolvedType (name));
    }